

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

exr_result_t scratch_seq_read(_internal_exr_seq_scratch *scr,void *buf,uint64_t sz)

{
  exr_const_context_t_conflict p_Var1;
  exr_result_t eVar2;
  exr_result_t eVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  int64_t nread;
  uint64_t local_40;
  uint64_t *local_38;
  
  local_38 = &scr->fileoff;
  eVar2 = -1;
  uVar5 = 0;
  local_40 = sz;
LAB_001220b1:
  do {
    if (sz == 0) {
LAB_001221a6:
      eVar3 = 0;
      if (uVar5 != local_40) {
        eVar3 = 10;
      }
      if (eVar2 != -1) {
        eVar3 = eVar2;
      }
      return eVar3;
    }
    uVar6 = scr->navail;
    if ((long)uVar6 < 1) {
      if (sz < 0x1000) {
        nread = 0;
        p_Var1 = scr->ctxt;
        uVar6 = p_Var1->file_size;
        uVar4 = 1;
        if ((0 < (long)uVar6) && (uVar4 = uVar6 - *local_38, *local_38 + 0x1000 <= uVar6)) {
          uVar4 = 0x1000;
        }
        eVar2 = (*p_Var1->do_read)(p_Var1,scr->scratch,uVar4,local_38,&nread,EXR_ALLOW_SHORT_READ);
        if (nread < 1) {
          if (nread == 0) {
            eVar2 = (*scr->ctxt->report_error)(scr->ctxt,10,"End of file attempting to read header")
            ;
          }
          goto LAB_001221a6;
        }
        scr->navail = nread;
        scr->curpos = 0;
      }
      else {
        nread = 0;
        eVar2 = (*scr->ctxt->do_read)
                          (scr->ctxt,buf,sz & 0xfffffffffffff000,local_38,&nread,EXR_MUST_READ_ALL);
        if (nread < 1) goto LAB_001221a6;
        sz = sz - nread;
        buf = (void *)((long)buf + nread);
        uVar5 = uVar5 + nread;
      }
      goto LAB_001220b1;
    }
    if (sz < uVar6) {
      uVar6 = sz;
    }
    memcpy(buf,scr->scratch + scr->curpos,uVar6);
    scr->curpos = scr->curpos + uVar6;
    scr->navail = scr->navail - uVar6;
    sz = sz - uVar6;
    buf = (void *)((long)buf + uVar6);
    uVar5 = uVar5 + uVar6;
  } while( true );
}

Assistant:

static exr_result_t
scratch_seq_read (struct _internal_exr_seq_scratch* scr, void* buf, uint64_t sz)
{
    uint8_t*     outbuf  = buf;
    uint64_t     nCopied = 0;
    uint64_t     notdone = sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            memcpy (outbuf, scr->scratch + scr->curpos, nCopy);
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            outbuf += nCopy;
            nCopied += nCopy;
        }
        else if (notdone >= SCRATCH_BUFFER_SIZE)
        {
            uint64_t nPages  = notdone / SCRATCH_BUFFER_SIZE;
            int64_t  nread   = 0;
            uint64_t nToRead = nPages * SCRATCH_BUFFER_SIZE;
            rv               = scr->ctxt->do_read (
                scr->ctxt,
                outbuf,
                nToRead,
                &(scr->fileoff),
                &nread,
                EXR_MUST_READ_ALL);
            if (nread > 0)
            {
                notdone -= (uint64_t) nread;
                outbuf += nread;
                nCopied += (uint64_t) nread;
            }
            else { break; }
        }
        else
        {
            int64_t nread = 0;
            uint64_t toread = SCRATCH_BUFFER_SIZE;

            if (scr->ctxt->file_size > 0)
            {
                if ((scr->fileoff + SCRATCH_BUFFER_SIZE) > scr->ctxt->file_size)
                {
                    toread = scr->ctxt->file_size - scr->fileoff;
                }
            }
            else
            {
                /*
                 * hrm, stream only with no known size, just read 1 byte at a
                 * time to be safer
                 */
                toread = 1;
            }

            rv = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                toread,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}